

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

tab_str_t *
str_add(tab_str_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,char *s,size_t len,size_t key,
       size_t flags,int key_p)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  tab_str_t el_00;
  tab_str_t el_01;
  int iVar4;
  char *__dest;
  tab_str_t *tab_str;
  tab_str_t el;
  tab_str_t str;
  
  tab_str = &el;
  iVar4 = str_exists_p(c2m_ctx,s,len,tab_str);
  if (iVar4 == 0) {
    __dest = (char *)reg_malloc(c2m_ctx,len);
    memcpy(__dest,s,len);
    tab_str = &str;
    el_00.str.len = len;
    el_00.str.s = __dest;
    el_00.key = key;
    el_00.flags = flags;
    str.str.s = __dest;
    str.str.len = len;
    str.key = key;
    str.flags = flags;
    HTAB_tab_str_t_do(c2m_ctx->str_tab,el_00,HTAB_INSERT,&el);
    if (key_p != 0) {
      el_01.str.len = str.str.len;
      el_01.str.s = str.str.s;
      el_01.key = str.key;
      el_01.flags = str.flags;
      HTAB_tab_str_t_do(c2m_ctx->str_key_tab,el_01,HTAB_INSERT,&el);
    }
  }
  sVar1 = (tab_str->str).len;
  sVar2 = tab_str->key;
  sVar3 = tab_str->flags;
  (__return_storage_ptr__->str).s = (tab_str->str).s;
  (__return_storage_ptr__->str).len = sVar1;
  __return_storage_ptr__->key = sVar2;
  __return_storage_ptr__->flags = sVar3;
  return __return_storage_ptr__;
}

Assistant:

static tab_str_t str_add (c2m_ctx_t c2m_ctx, const char *s, size_t len, size_t key, size_t flags,
                          int key_p) {
  char *heap_s;
  tab_str_t el, str;

  if (str_exists_p (c2m_ctx, s, len, &el)) return el;
  heap_s = reg_malloc (c2m_ctx, len);
  memcpy (heap_s, s, len);
  str.str.s = heap_s;
  str.str.len = len;
  str.key = key;
  str.flags = flags;
  HTAB_DO (tab_str_t, str_tab, str, HTAB_INSERT, el);
  if (key_p) HTAB_DO (tab_str_t, str_key_tab, str, HTAB_INSERT, el);
  return str;
}